

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  _Rb_tree_node_base *__lhs;
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  char *command;
  _Base_ptr p_Var3;
  ostream *poVar4;
  string *psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  allocator<char> local_219;
  cmLocalGenerator *local_218;
  string *local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string langFlagRegexVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts_1;
  
  local_218 = this;
  local_210 = flags;
  std::__cxx11::string::string<std::allocator<char>>((string *)&opts,"CMAKE_",&local_219);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts,lang);
  std::operator+(&langFlagRegexVar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts_1,
                 "_FLAG_REGEX");
  std::__cxx11::string::~string((string *)&opts_1);
  std::__cxx11::string::~string((string *)&opts);
  pcVar2 = cmMakefile::GetDefinition(local_218->Makefile,&langFlagRegexVar);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&opts_1,"COMPILE_FLAGS",(allocator<char> *)&opts);
    pcVar2 = cmGeneratorTarget::GetProperty(target,(string *)&opts_1);
    std::__cxx11::string::~string((string *)&opts_1);
    if (pcVar2 != (char *)0x0) {
      (*local_218->_vptr_cmLocalGenerator[7])(local_218,local_210,pcVar2);
    }
    opts_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    opts_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    opts_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetCompileOptions(target,&opts_1,config,lang);
    AppendCompileOptions(local_218,local_210,&opts_1,(char *)0x0);
    this_01 = &opts_1;
  }
  else {
    opts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    opts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    opts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&opts_1,"COMPILE_FLAGS",&local_219)
    ;
    command = cmGeneratorTarget::GetProperty(target,(string *)&opts_1);
    std::__cxx11::string::~string((string *)&opts_1);
    if (command != (char *)0x0) {
      cmSystemTools::ParseWindowsCommandLine(command,&opts);
    }
    cmGeneratorTarget::GetCompileOptions(target,&opts,config,lang);
    AppendCompileOptions(local_218,local_210,&opts,pcVar2);
    this_01 = &opts;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_01);
  p_Var3 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 ==
        &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header) {
      AddCompilerRequirementFlag(local_218,local_210,target,lang);
LAB_001d3e92:
      std::__cxx11::string::~string((string *)&langFlagRegexVar);
      return;
    }
    __lhs = p_Var3 + 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   "_STANDARD");
    pcVar2 = cmGeneratorTarget::GetProperty
                       (target,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &opts_1);
    std::__cxx11::string::~string((string *)&opts_1);
    if (pcVar2 != (char *)0x0) {
      this_00 = local_218->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&opts_1,pcVar2,(allocator<char> *)&opts);
      bVar1 = cmMakefile::IsLaterStandard
                        (this_00,(string *)__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &opts_1,(string *)(p_Var3 + 2));
      std::__cxx11::string::~string((string *)&opts_1);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&opts_1);
        poVar4 = std::operator<<((ostream *)&opts_1,"The COMPILE_FEATURES property of target \"");
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,
                                 "\" was evaluated when computing the link implementation, and the \""
                                );
        poVar4 = std::operator<<(poVar4,(string *)__lhs);
        poVar4 = std::operator<<(poVar4,"_STANDARD\" was \"");
        poVar4 = std::operator<<(poVar4,(string *)(p_Var3 + 2));
        poVar4 = std::operator<<(poVar4,
                                 "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                                );
        poVar4 = std::operator<<(poVar4,(string *)__lhs);
        poVar4 = std::operator<<(poVar4,"_STANDARD\" \"");
        poVar4 = std::operator<<(poVar4,pcVar2);
        poVar4 = std::operator<<(poVar4,
                                 "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation."
                                );
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::stringbuf::str();
        IssueMessage(local_218,FATAL_ERROR,(string *)&opts);
        std::__cxx11::string::~string((string *)&opts);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&opts_1);
        goto LAB_001d3e92;
      }
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::string& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = std::string("CMAKE_") + lang + "_FLAG_REGEX";

  if (const char* langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    std::vector<std::string> opts;
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      cmSystemTools::ParseWindowsCommandLine(targetFlags, opts);
    }
    target->GetCompileOptions(opts, config, lang);
    // (Re-)Escape these flags.  COMPILE_FLAGS were already parsed
    // as a command line above, and COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, opts, langFlagRegexStr);
  } else {
    // Use all flags.
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      this->AppendFlags(flags, targetFlags);
    }
    std::vector<std::string> opts;
    target->GetCompileOptions(opts, config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, opts);
  }

  for (auto const& it : target->GetMaxLanguageStandards()) {
    const char* standard = target->GetProperty(it.first + "_STANDARD");
    if (!standard) {
      continue;
    }
    if (this->Makefile->IsLaterStandard(it.first, standard, it.second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it.first << "_STANDARD\" was \"" << it.second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it.first << "_STANDARD\" \"" << standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation."
        << std::endl;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }
  this->AddCompilerRequirementFlag(flags, target, lang);
}